

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,DistributionMapping *pmap)

{
  element_type *peVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  
  poVar2 = std::operator<<(os,"(DistributionMapping");
  std::operator<<(poVar2,'\n');
  for (lVar3 = 0;
      peVar1 = (pmap->m_ref).
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,
      lVar3 < (long)*(pointer *)
                     ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
              *(long *)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2;
      lVar3 = lVar3 + 1) {
    poVar2 = std::operator<<(os,"m_pmap[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3);
    poVar2 = std::operator<<(poVar2,"] = ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)(*(long *)&(((pmap->m_ref).
                                                                                                        
                                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_pmap).
                                                  super_vector<int,_std::allocator<int>_>.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + lVar3 * 4));
    std::operator<<(poVar2,'\n');
  }
  poVar2 = std::operator<<(os,')');
  std::operator<<(poVar2,'\n');
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator<<(ostream &, DistributionMapping &) failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&              os,
            const DistributionMapping& pmap)
{
    os << "(DistributionMapping" << '\n';

    for (int i = 0; i < pmap.ProcessorMap().size(); ++i)
    {
        os << "m_pmap[" << i << "] = " << pmap.ProcessorMap()[i] << '\n';
    }

    os << ')' << '\n';

    if (os.fail())
        amrex::Error("operator<<(ostream &, DistributionMapping &) failed");

    return os;
}